

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_FlagsValidator_ValidFlagViaSetValue::Run(void)

{
  bool bVar1;
  char *pcVar2;
  FlagSettingMode in_R8D;
  FlagSaver fs;
  string local_38;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","FlagsValidator");
  bVar1 = RegisterFlagValidator(&(anonymous_namespace)::fLI::FLAGS_test_flag,ValidateTestFlagIs5);
  if (bVar1) {
    (anonymous_namespace)::fLI::FLAGS_test_flag = 100;
    SetCommandLineOptionWithMode_abi_cxx11_(&local_38,(gflags *)0x14d2f1,"5",(char *)0x0,in_R8D);
    bVar1 = std::operator!=("",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      pcVar2 = (char *)0x2;
      SetCommandLineOptionWithMode_abi_cxx11_(&local_38,(gflags *)0x14d2f1,"5",(char *)0x2,in_R8D);
      bVar1 = std::operator!=("",&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      if (bVar1) {
        SetCommandLineOption_abi_cxx11_(&local_38,(gflags *)0x14d2f1,"5",pcVar2);
        bVar1 = std::operator!=("",&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        if (bVar1) {
          bVar1 = RegisterFlagValidator
                            (&(anonymous_namespace)::fLI::FLAGS_test_flag,
                             (_func_bool_char_ptr_int32 *)0x0);
          if (bVar1) {
            FlagSaver::~FlagSaver(&fs);
            return;
          }
          pcVar2 = "RegisterFlagValidator(&FLAGS_test_flag, NULL)";
          goto LAB_00139f36;
        }
        pcVar2 = "SetCommandLineOption(\"test_flag\", \"5\")";
      }
      else {
        pcVar2 = "SetCommandLineOptionWithMode(\"test_flag\", \"5\", SET_FLAGS_DEFAULT)";
      }
    }
    else {
      pcVar2 = "SetCommandLineOptionWithMode(\"test_flag\", \"5\", SET_FLAGS_VALUE)";
    }
    fprintf(_stderr,"Check failed: %s %s %s\n","\"\"","!=",pcVar2);
  }
  else {
    pcVar2 = "RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5)";
LAB_00139f36:
    fprintf(_stderr,"Check failed: %s\n",pcVar2);
  }
  exit(1);
}

Assistant:

TEST(FlagsValidator, ValidFlagViaSetValue) {
  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5));
  FLAGS_test_flag = 100;   // doesn't trigger the validator
  // SetCommandLineOptionWithMode returns the empty string on error.
  EXPECT_NE("", SetCommandLineOptionWithMode("test_flag", "5",
                                             SET_FLAGS_VALUE));
  EXPECT_NE("", SetCommandLineOptionWithMode("test_flag", "5",
                                             SET_FLAGS_DEFAULT));
  EXPECT_NE("", SetCommandLineOption("test_flag", "5"));
  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, NULL));
}